

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O1

unsigned_long __thiscall
vector_bagwell<unsigned_long,_16U>::operator[]
          (vector_bagwell<unsigned_long,_16U> *this,size_t index)

{
  pointer ppuVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->_insertpos == (unsigned_long *)0x0) {
    uVar3 = 0;
  }
  else {
    ppuVar1 = (this->_index_block).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar3 = (long)this->_insertpos +
            ((long)((1 << ((char)((uint)((int)ppuVar1 -
                                        *(int *)&(this->_index_block).
                                                 super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                           3U & 0x1f)) + -0x10) * 8 - (long)ppuVar1[-1]) >> 3;
  }
  if (index < uVar3) {
    uVar4 = index + 0x10;
    uVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar2 = (byte)uVar3 & 0x1f;
    return (this->_index_block).
           super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
           super__Vector_impl_data._M_start[(uVar3 ^ 0x1fffffffffffffc0) + 0x3c]
           [(long)(int)(-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2) & uVar4];
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/vector_bagwell.h"
                ,0x46,
                "T vector_bagwell<unsigned long>::operator[](size_t) const [T = unsigned long, Initial = 16]"
               );
}

Assistant:

bool empty() const { return _insertpos==0; }